

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O0

int __thiscall ncnn::LRN::load_param(LRN *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xb8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,5);
  *(int *)(in_RDI + 0xbc) = iVar1;
  fVar2 = ParamDict::get(in_RSI,2,1.0);
  *(float *)(in_RDI + 0xc0) = fVar2;
  fVar2 = ParamDict::get(in_RSI,3,0.75);
  *(float *)(in_RDI + 0xc4) = fVar2;
  fVar2 = ParamDict::get(in_RSI,4,1.0);
  *(float *)(in_RDI + 200) = fVar2;
  return 0;
}

Assistant:

int LRN::load_param(const ParamDict& pd)
{
    region_type = pd.get(0, 0);
    local_size = pd.get(1, 5);
    alpha = pd.get(2, 1.f);
    beta = pd.get(3, 0.75f);
    bias = pd.get(4, 1.f);

    return 0;
}